

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::DisplayComponents
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg,string *name)

{
  uint uVar1;
  pointer pcVar2;
  uint *puVar3;
  FILE *__stream;
  uint uVar4;
  string *psVar5;
  ulong uVar6;
  uint *puVar7;
  
  fprintf(_stderr,"The strongly connected components for the %s graph are:\n",
          (name->_M_dataplus)._M_p);
  uVar4 = (uint)(((long)(ccg->Components).
                        super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(ccg->Components).
                       super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl
                       .super__Vector_impl_data._M_start) / 0x18);
  if (0 < (int)uVar4) {
    uVar6 = 0;
    do {
      pcVar2 = (ccg->Components).
               super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      fprintf(_stderr,"Component (%d):\n",uVar6 & 0xffffffff);
      puVar3 = *(uint **)((long)&pcVar2[uVar6].super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
      for (puVar7 = *(uint **)&pcVar2[uVar6].super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl;
          __stream = _stderr, puVar7 != puVar3; puVar7 = puVar7 + 1) {
        uVar1 = *puVar7;
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((this->Targets).
                            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[(int)uVar1]);
        fprintf(__stream,"  contains target %d [%s]\n",(ulong)uVar1,(psVar5->_M_dataplus)._M_p);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uVar4 & 0x7fffffff));
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeTargetDepends::DisplayComponents(
  cmComputeComponentGraph const& ccg, const std::string& name)
{
  fprintf(stderr, "The strongly connected components for the %s graph are:\n",
          name.c_str());
  std::vector<NodeList> const& components = ccg.GetComponents();
  int n = static_cast<int>(components.size());
  for (int c = 0; c < n; ++c) {
    NodeList const& nl = components[c];
    fprintf(stderr, "Component (%d):\n", c);
    for (int i : nl) {
      fprintf(stderr, "  contains target %d [%s]\n", i,
              this->Targets[i]->GetName().c_str());
    }
  }
  fprintf(stderr, "\n");
}